

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

exr_result_t
exr_read_scanline_chunk_info(exr_const_context_t ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  exr_storage_t eVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  _internal_exr_part *part;
  ulong uVar5;
  exr_result_t eVar6;
  int iVar7;
  int iVar8;
  code *UNRECOVERED_JUMPTABLE_00;
  int iVar9;
  char *pcVar10;
  int lpc;
  ulong uVar11;
  uint uVar12;
  undefined8 uStackY_b0;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar14;
  undefined8 uVar13;
  uint64_t dataoff;
  ulong local_80;
  int32_t data [3];
  uint64_t *ctable;
  uint64_t chunkmin;
  int64_t ddata [3];
  
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt != (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uStackY_b0 = 7;
LAB_0011bad5:
    eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,uStackY_b0);
    return eVar6;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar6 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar6;
  }
  if (cinfo == (exr_chunk_info_t *)0x0) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uStackY_b0 = 3;
    goto LAB_0011bad5;
  }
  part = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
  eVar1 = part->storage_mode;
  if ((eVar1 | EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_DEEP_TILED) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uStackY_b0 = 0x12;
    goto LAB_0011bad5;
  }
  uVar2 = (part->data_window).min.field_0.field_0.y;
  iVar8 = (part->data_window).max.field_0.field_0.y;
  uVar12 = y - uVar2;
  if (iVar8 < y || y < (int)uVar2) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
    pcVar10 = "Invalid request for scanline %d outside range of data window (%d - %d)";
    uVar12 = uVar2;
    iVar7 = iVar8;
LAB_0011bc42:
    eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar10,y,uVar12,iVar7);
    return eVar6;
  }
  iVar3 = (part->data_window).min.field_0.field_0.x;
  iVar4 = (part->data_window).max.field_0.field_0.x;
  lpc = (int)part->lines_per_chunk;
  if (1 < lpc) {
    uVar12 = (int)uVar12 / lpc;
  }
  iVar7 = part->chunk_count;
  if (((int)uVar12 < 0) || (iVar7 <= (int)uVar12)) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
    pcVar10 = "Invalid request for scanline %d in chunk %d outside chunk count %d";
    goto LAB_0011bc42;
  }
  iVar7 = uVar12 * lpc;
  iVar9 = iVar7 + uVar2;
  cinfo->idx = uVar12;
  cinfo->type = (uint8_t)eVar1;
  cinfo->compression = (char)part->comp_type;
  cinfo->start_x = iVar3;
  cinfo->start_y = iVar9;
  cinfo->width = (iVar4 - iVar3) + 1;
  cinfo->height = lpc;
  if (iVar7 < 0) {
    cinfo->start_y = uVar2;
    iVar7 = iVar7 + lpc;
LAB_0011bc5c:
    cinfo->height = iVar7;
  }
  else if (iVar8 < iVar9 + lpc) {
    iVar7 = (iVar8 - iVar9) + 1;
    goto LAB_0011bc5c;
  }
  cinfo->level_x = '\0';
  cinfo->level_y = '\0';
  eVar6 = extract_chunk_table((_internal_exr_context *)ctxt,part,&ctable,&chunkmin);
  if (eVar6 != 0) {
    return eVar6;
  }
  uVar5 = *(ulong *)(ctxt + 0x98);
  dataoff = ctable[uVar12];
  if ((dataoff < chunkmin) || ((0 < (long)uVar5 && (uVar5 < dataoff)))) {
    eVar6 = (**(code **)(ctxt + 0x48))
                      (ctxt,0x16,
                       "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %lu"
                       ,y,uVar12);
    return eVar6;
  }
  local_80 = 0;
  iVar8 = (**(code **)(ctxt + 0x28))
                    (ctxt,data,
                     ((uint)(part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) -
                     (uint)(ctxt[5] == (_priv_exr_context_t)0x0)) * 4 + 8,&dataoff,0,0);
  if (iVar8 != 0) {
    return iVar8;
  }
  if (ctxt[5] != (_priv_exr_context_t)0x0) {
    if (data[0] != part_index) {
      uVar13 = CONCAT44(uVar14,part_index);
      pcVar10 = 
      "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d";
      goto LAB_0011bdbd;
    }
    local_80 = 1;
  }
  uVar11 = local_80 & 0xffffffff;
  data[0] = data[uVar11];
  if (iVar9 != data[0]) {
    uVar13 = CONCAT44(uVar14,iVar9);
    pcVar10 = 
    "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d";
LAB_0011bdbd:
    eVar6 = (**(code **)(ctxt + 0x48))(ctxt,0x16,pcVar10,y,uVar12,data[0],uVar13);
    return eVar6;
  }
  if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE) {
    iVar8 = (**(code **)(ctxt + 0x28))(ctxt,ddata,0x18,&dataoff,0,0);
    if (iVar8 != 0) {
      return iVar8;
    }
    if (ddata[0] < 0) {
      pcVar10 = 
      "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %ld"
      ;
      ddata[1] = ddata[0];
    }
    else if ((ddata[1] & 0xffffffff80000000U) == 0) {
      if ((ddata[2] & 0xffffffff80000000U) == 0) {
        uVar11 = dataoff + ddata[0];
        cinfo->sample_count_data_offset = dataoff;
        cinfo->sample_count_table_size = ddata[0];
        cinfo->data_offset = uVar11;
        cinfo->packed_size = ddata[1];
        cinfo->unpacked_size = ddata[2];
        if (((long)uVar5 < 1) || (uVar11 + ddata[1] <= uVar5 && uVar11 <= uVar5)) goto LAB_0011bf06;
        pcVar10 = 
        "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %ld + data size %ld larger than file %ld"
        ;
        ddata[1] = ddata[0];
      }
      else {
        pcVar10 = 
        "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %ld"
        ;
        ddata[1] = ddata[2];
      }
    }
    else {
      pcVar10 = 
      "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %ld"
      ;
    }
  }
  else {
    ddata[2] = compute_chunk_unpack_size(y,cinfo->width,cinfo->height,lpc,part);
    ddata[1] = (int64_t)data[uVar11 + 1];
    if ((ddata[1] < 0) || (part->unpacked_size_per_chunk < (ulong)ddata[1])) {
      pcVar10 = 
      "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %lu, must be between 0 and %lu"
      ;
    }
    else {
      cinfo->data_offset = dataoff;
      cinfo->packed_size = ddata[1];
      cinfo->unpacked_size = ddata[2];
      cinfo->sample_count_data_offset = 0;
      cinfo->sample_count_table_size = 0;
      if (((long)uVar5 < 1) || (dataoff + ddata[1] <= uVar5)) {
LAB_0011bf06:
        if (ddata[1] != 0) {
          return 0;
        }
        if (ddata[2] == 0) {
          return 0;
        }
        eVar6 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid packed size of 0");
        return eVar6;
      }
      pcVar10 = 
      "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %lu, file offset %lu, size %ld"
      ;
    }
  }
  eVar6 = (**(code **)(ctxt + 0x48))(ctxt,0x16,pcVar10,y,uVar12,ddata[1]);
  return eVar6;
}

Assistant:

exr_result_t
exr_read_scanline_chunk_info (
    exr_const_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_result_t     rv;
    int              miny, cidx, rdcnt, lpc;
    int32_t          data[3];
    int64_t          ddata[3];
    int64_t          fsize;
    uint64_t         chunkmin, dataoff;
    exr_attr_box2i_t dw;
    uint64_t*        ctable;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!cinfo) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        return pctxt->standard_error (pctxt, EXR_ERR_SCAN_TILE_MIXEDAPI);
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y);
    }

    lpc  = part->lines_per_chunk;
    cidx = (y - dw.min.y);
    if (lpc > 1) cidx /= lpc;

    // do we need to invert this when reading decreasing y? it appears not
    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = (dw.min.y + cidx * lpc);

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count);
    }

    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= (dw.min.y - miny);
    }
    else if ((miny + lpc) > dw.max.y) { cinfo->height = (dw.max.y - miny + 1); }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    /* need to read from the file to get the packed chunk size */
    rv = extract_chunk_table (pctxt, part, &ctable, &chunkmin);
    if (rv != EXR_ERR_SUCCESS) return rv;

    fsize = pctxt->file_size;

    dataoff = ctable[cidx];
    if (dataoff < chunkmin || (fsize > 0 && dataoff > (uint64_t) fsize))
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %" PRIu64,
            y,
            cidx,
            dataoff);
    }

    /* TODO: Look at collapsing this into extract_chunk_leader, only
     * issue is more concrete error messages */
    /* multi part files have the part for validation */
    rdcnt = (pctxt->is_multipart) ? 2 : 1;
    /* deep has 64-bit data, so be variable about what we read */
    if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++rdcnt;

    rv = pctxt->do_read (
        pctxt,
        data,
        (size_t) (rdcnt) * sizeof (int32_t),
        &dataoff,
        NULL,
        EXR_MUST_READ_ALL);

    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, rdcnt);

    rdcnt = 0;
    if (pctxt->is_multipart)
    {
        if (data[rdcnt] != part_index)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d",
                y,
                cidx,
                data[rdcnt],
                part_index);
        }
        ++rdcnt;
    }
    if (miny != data[rdcnt])
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d",
            y,
            cidx,
            data[rdcnt],
            miny);
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        rv = pctxt->do_read (
            pctxt,
            ddata,
            3 * sizeof (int64_t),
            &dataoff,
            NULL,
            EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
        priv_to_native64 (ddata, 3);

        if (ddata[0] < 0)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %" PRId64,
                y,
                cidx,
                ddata[0]);
        }
        if (ddata[1] < 0 || ddata[1] > (int64_t) INT_MAX)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %" PRId64,
                y,
                cidx,
                ddata[1]);
        }
        if (ddata[2] < 0 || ddata[2] > (int64_t) INT_MAX)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %" PRId64,
                y,
                cidx,
                ddata[2]);
        }

        cinfo->sample_count_data_offset = dataoff;
        cinfo->sample_count_table_size  = (uint64_t) ddata[0];
        cinfo->data_offset              = dataoff + (uint64_t) ddata[0];
        cinfo->packed_size              = (uint64_t) ddata[1];
        cinfo->unpacked_size            = (uint64_t) ddata[2];

        if (fsize > 0 &&
            ((cinfo->sample_count_data_offset +
              cinfo->sample_count_table_size) > ((uint64_t) fsize) ||
             (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize)))
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %" PRId64
                " + data size %" PRId64 " larger than file %" PRId64,
                y,
                cidx,
                ddata[0],
                ddata[1],
                fsize);
        }
    }
    else
    {
        uint64_t unpacksize = compute_chunk_unpack_size (
            y, cinfo->width, cinfo->height, lpc, part);

        ++rdcnt;
        if (data[rdcnt] < 0 ||
            (uint64_t) data[rdcnt] > part->unpacked_size_per_chunk)
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %" PRIu64
                ", must be between 0 and %" PRIu64,
                y,
                cidx,
                (uint64_t) data[rdcnt],
                part->unpacked_size_per_chunk);
        }

        cinfo->data_offset              = dataoff;
        cinfo->packed_size              = (uint64_t) data[rdcnt];
        cinfo->unpacked_size            = unpacksize;
        cinfo->sample_count_data_offset = 0;
        cinfo->sample_count_table_size  = 0;

        if (fsize > 0 &&
            (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize))
        {
            return pctxt->print_error (
                pctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %" PRIu64
                ", file offset %" PRIu64 ", size %" PRId64,
                y,
                cidx,
                cinfo->packed_size,
                cinfo->data_offset,
                fsize);
        }
    }

    if (cinfo->packed_size == 0 && cinfo->unpacked_size > 0)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid packed size of 0");
    return EXR_ERR_SUCCESS;
}